

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogMQ.cpp
# Opt level: O0

void __thiscall liblogger::LogMQ::Log(LogMQ *this,LogType Type,string *str)

{
  int iVar1;
  string *message;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  undefined8 uVar5;
  uint in_ESI;
  long in_RDI;
  stringstream ss;
  int len;
  char *buf;
  string *in_stack_fffffffffffffdd8;
  LogException *in_stack_fffffffffffffde0;
  LogException *this_00;
  undefined4 in_stack_fffffffffffffdf4;
  char *in_stack_fffffffffffffdf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  stringstream local_1e8 [16];
  ostream local_1d8 [379];
  undefined1 local_5d;
  undefined1 local_49 [41];
  char *local_20 [4];
  
  local_20[0] = (char *)0x0;
  std::__cxx11::string::c_str();
  local_49._37_4_ = asprintf(local_20,"%d:%s",(ulong)in_ESI);
  if (local_20[0] == (char *)0x0) {
    local_5d = 1;
    message = (string *)__cxa_allocate_exception(0x28);
    this_00 = (LogException *)local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffdf4,in_ESI));
    LogException::LogException(this_00,message);
    local_5d = 0;
    __cxa_throw(message,&LogException::typeinfo,LogException::~LogException);
  }
  iVar1 = mq_send(*(mqd_t *)(in_RDI + 0x28),local_20[0],(long)(int)local_49._37_4_,0);
  if (iVar1 < 0) {
    std::__cxx11::stringstream::stringstream(local_1e8);
    poVar2 = std::operator<<(local_1d8,"LogMQ::Log failed to write to queue: ");
    poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 8));
    poVar2 = std::operator<<(poVar2,"\' error: ");
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    std::operator<<(poVar2,pcVar4);
    free(local_20[0]);
    uVar5 = __cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    LogException::LogException(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    __cxa_throw(uVar5,&LogException::typeinfo,LogException::~LogException);
  }
  free(local_20[0]);
  return;
}

Assistant:

void LogMQ::Log(const LogType Type, const std::string &str) {
	char *buf = 0;
	int len = asprintf(&buf, "%d:%s", Type, str.c_str());
	if (!buf) {
		throw(LogException("LogMQ::Log Malloc Failed"));
	}

	if (mq_send(m_id, buf, len, 0) < 0) {
		std::stringstream ss;
		ss << "LogMQ::Log failed to write to queue: " << m_QName << "' error: " << strerror(errno);
		free(buf);
		throw(LogException(ss.str()));
	}

	free(buf);
}